

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall test_solvers_3x3::test_method(test_solvers_3x3 *this)

{
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  matrix;
  size_t expected_assignment [3];
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_50;
  unsigned_long local_28 [3];
  
  local_28[0] = 1;
  local_28[1] = 0;
  local_28[2] = 2;
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::matrix(&local_50,3,3);
  local_50.data_.data_[4] = 2;
  local_50.data_.data_[5] = -1;
  local_50.data_.data_[6] = 3;
  local_50.data_.data_[7] = 0;
  local_50.data_.data_[0] = 1;
  local_50.data_.data_[1] = 2;
  local_50.data_.data_[2] = 4;
  local_50.data_.data_[3] = 0;
  local_50.data_.data_[8] = -3;
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,local_28,
             (unsigned_long *)&stack0xfffffffffffffff0,&local_69);
  assert_solvers_result<int,std::less<int>>(&local_50,-1,&local_68,(less<int> *)&local_69);
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.data_.size_ != 0) {
    operator_delete(local_50.data_.data_);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_3x3)
{
  const int costs[] = {1, 2, 4,
                       0, 2, -1,
                       3, 0, -3};
  const std::size_t expected_assignment[] = {1, 0, 2};
  assert_solvers_result(make_matrix(costs, 3, 3), -1, make_vector(expected_assignment, 3));
}